

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsst.cpp
# Opt level: O2

void duckdb::FSSTStorage::StringScanPartial<true>
               (ColumnSegment *segment,ColumnScanState *state,idx_t scan_count,Vector *result,
               idx_t result_offset)

{
  BufferHandle *this;
  bool bVar1;
  idx_t iVar2;
  FSSTScanState *scan_state;
  idx_t start;
  DBConfig *pDVar3;
  data_ptr_t pdVar4;
  StringDictionaryContainer dict;
  BlockManager *this_00;
  idx_t iVar5;
  ulong uVar6;
  VectorStringBuffer *str_buffer;
  data_ptr_t pdVar7;
  string_t sVar8;
  bp_delta_offsets_t offsets;
  
  scan_state = (FSSTScanState *)
               unique_ptr<duckdb::SegmentScanState,_std::default_delete<duckdb::SegmentScanState>,_true>
               ::operator->(&state->scan_state);
  start = state->row_index - (segment->super_SegmentBase<duckdb::ColumnSegment>).start;
  pDVar3 = DBConfig::GetConfig(segment->db);
  bVar1 = (pDVar3->options).enable_fsst_vectors;
  this = &(scan_state->super_StringScanState).handle;
  pdVar4 = BufferHandle::Ptr(this);
  iVar2 = segment->offset;
  dict = GetDictionary(segment,this);
  if (scan_count != 0) {
    if ((bVar1 != false) &&
       ((scan_state->duckdb_fsst_decoder).internal.
        super___shared_ptr<void,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0)) {
      Vector::SetVectorType(result,FSST_VECTOR);
      this_00 = ColumnSegment::GetBlockManager(segment);
      iVar5 = BlockManager::GetBlockSize(this_00);
      uVar6 = iVar5 >> 2 & 0xfffffffffffffff8;
      iVar5 = 0x1000;
      if (uVar6 < 0x1000) {
        iVar5 = uVar6;
      }
      FSSTVector::RegisterDecoder(result,&scan_state->duckdb_fsst_decoder,iVar5);
    }
    pdVar7 = result->data;
    StartScan(&offsets,scan_state,pdVar4 + iVar2 + 0x10,start,scan_count);
    if (bVar1 == false) {
      str_buffer = StringVector::GetStringBuffer(result);
      pdVar7 = pdVar7 + result_offset * 0x10 + 8;
      for (iVar5 = 0; scan_count != iVar5; iVar5 = iVar5 + 1) {
        sVar8 = FSSTScanState::DecompressString
                          (scan_state,dict,pdVar4 + iVar2,&offsets,iVar5,str_buffer);
        *(long *)(pdVar7 + -8) = sVar8.value._0_8_;
        *(long *)pdVar7 = sVar8.value._8_8_;
        pdVar7 = pdVar7 + 0x10;
      }
    }
    else {
      pdVar7 = pdVar7 + 8;
      for (iVar5 = 0; scan_count != iVar5; iVar5 = iVar5 + 1) {
        sVar8 = UncompressedStringStorage::FetchStringFromDict
                          (segment,dict.end,result,pdVar4 + iVar2,
                           (scan_state->delta_decode_buffer).
                           super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>.
                           _M_t.
                           super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                           .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl
                           [offsets.unused_delta_decoded_values + iVar5],
                           (scan_state->bitunpack_buffer).
                           super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>.
                           _M_t.
                           super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>
                           .super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl
                           [offsets.scan_offset + iVar5]);
        *(long *)(pdVar7 + -8) = sVar8.value._0_8_;
        *(long *)pdVar7 = sVar8.value._8_8_;
        FSSTVector::SetCount(result,scan_count);
        pdVar7 = pdVar7 + 0x10;
      }
    }
    scan_state->last_known_index =
         (scan_state->delta_decode_buffer).
         super_unique_ptr<unsigned_int[],_std::default_delete<unsigned_int[]>_>._M_t.
         super___uniq_ptr_impl<unsigned_int,_std::default_delete<unsigned_int[]>_>._M_t.
         super__Tuple_impl<0UL,_unsigned_int_*,_std::default_delete<unsigned_int[]>_>.
         super__Head_base<0UL,_unsigned_int_*,_false>._M_head_impl
         [offsets.unused_delta_decoded_values + scan_count + 0xffffffffffffffff];
    scan_state->last_known_row = start + scan_count + -1;
  }
  return;
}

Assistant:

void FSSTStorage::StringScanPartial(ColumnSegment &segment, ColumnScanState &state, idx_t scan_count, Vector &result,
                                    idx_t result_offset) {

	auto &scan_state = state.scan_state->Cast<FSSTScanState>();
	auto start = segment.GetRelativeIndex(state.row_index);

	bool enable_fsst_vectors;
	if (ALLOW_FSST_VECTORS) {
		auto &config = DBConfig::GetConfig(segment.db);
		enable_fsst_vectors = config.options.enable_fsst_vectors;
	} else {
		enable_fsst_vectors = false;
	}

	auto baseptr = scan_state.handle.Ptr() + segment.GetBlockOffset();
	auto dict = GetDictionary(segment, scan_state.handle);
	auto base_data = data_ptr_cast(baseptr + sizeof(fsst_compression_header_t));
	string_t *result_data;

	if (scan_count == 0) {
		return;
	}

	if (enable_fsst_vectors) {
		D_ASSERT(result_offset == 0);
		if (scan_state.duckdb_fsst_decoder) {
			D_ASSERT(result_offset == 0 || result.GetVectorType() == VectorType::FSST_VECTOR);
			result.SetVectorType(VectorType::FSST_VECTOR);
			auto string_block_limit = StringUncompressed::GetStringBlockLimit(segment.GetBlockManager().GetBlockSize());
			FSSTVector::RegisterDecoder(result, scan_state.duckdb_fsst_decoder, string_block_limit);
			result_data = FSSTVector::GetCompressedData<string_t>(result);
		} else {
			D_ASSERT(result.GetVectorType() == VectorType::FLAT_VECTOR);
			result_data = FlatVector::GetData<string_t>(result);
		}
	} else {
		D_ASSERT(result.GetVectorType() == VectorType::FLAT_VECTOR);
		result_data = FlatVector::GetData<string_t>(result);
	}

	auto offsets = StartScan(scan_state, base_data, start, scan_count);
	auto &bitunpack_buffer = scan_state.bitunpack_buffer;
	auto &delta_decode_buffer = scan_state.delta_decode_buffer;
	if (enable_fsst_vectors) {
		// Lookup decompressed offsets in dict
		for (idx_t i = 0; i < scan_count; i++) {
			uint32_t string_length = bitunpack_buffer[i + offsets.scan_offset];
			result_data[i] = UncompressedStringStorage::FetchStringFromDict(
			    segment, dict.end, result, baseptr,
			    UnsafeNumericCast<int32_t>(delta_decode_buffer[i + offsets.unused_delta_decoded_values]),
			    string_length);
			FSSTVector::SetCount(result, scan_count);
		}
	} else {
		// Just decompress
		auto &str_buffer = StringVector::GetStringBuffer(result);
		for (idx_t i = 0; i < scan_count; i++) {
			result_data[i + result_offset] = scan_state.DecompressString(dict, baseptr, offsets, i, str_buffer);
		}
	}
	EndScan(scan_state, offsets, start, scan_count);
}